

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void * NULLC::AllocObject(int size,uint type)

{
  int iVar1;
  ExternTypeInfo *pEVar2;
  uint local_44;
  undefined1 local_40 [4];
  int finalize;
  Range range;
  void *ptr;
  ulong *puStack_20;
  uint realSize;
  void *data;
  uint type_local;
  int size_local;
  
  if (size < 0) {
    nullcThrowError("ERROR: requested memory size is less than zero");
    _type_local = (ulong *)0x0;
  }
  else {
    iVar1 = size + 8;
    if (globalMemoryLimit < (uint)(usedMemory + iVar1)) {
      CollectMemory();
      if (globalMemoryLimit < (uint)(usedMemory + iVar1)) {
        nullcThrowError("ERROR: reached global memory maximum");
        return (void *)0x0;
      }
    }
    else if (collectableMinimum < (uint)(usedMemory + iVar1)) {
      CollectMemory();
    }
    if (iVar1 < 0x41) {
      if (iVar1 < 0x11) {
        if (iVar1 < 9) {
          puStack_20 = (ulong *)ObjectBlockPool<8,_8192>::Alloc((ObjectBlockPool<8,_8192> *)pool8);
          ptr._4_4_ = 8;
        }
        else {
          puStack_20 = (ulong *)ObjectBlockPool<16,_4096>::Alloc
                                          ((ObjectBlockPool<16,_4096> *)pool16);
          ptr._4_4_ = 0x10;
        }
      }
      else if (iVar1 < 0x21) {
        puStack_20 = (ulong *)ObjectBlockPool<32,_2048>::Alloc((ObjectBlockPool<32,_2048> *)pool32);
        ptr._4_4_ = 0x20;
      }
      else {
        puStack_20 = (ulong *)ObjectBlockPool<64,_1024>::Alloc((ObjectBlockPool<64,_1024> *)pool64);
        ptr._4_4_ = 0x40;
      }
    }
    else if (iVar1 < 0x101) {
      if (iVar1 < 0x81) {
        puStack_20 = (ulong *)ObjectBlockPool<128,_512>::Alloc((ObjectBlockPool<128,_512> *)pool128)
        ;
        ptr._4_4_ = 0x80;
      }
      else {
        puStack_20 = (ulong *)ObjectBlockPool<256,_256>::Alloc((ObjectBlockPool<256,_256> *)pool256)
        ;
        ptr._4_4_ = 0x100;
      }
    }
    else if (iVar1 < 0x201) {
      puStack_20 = (ulong *)ObjectBlockPool<512,_128>::Alloc((ObjectBlockPool<512,_128> *)pool512);
      ptr._4_4_ = 0x200;
    }
    else {
      range.end = alignedAlloc(size,0xc);
      if (range.end == (void *)0x0) {
        nullcThrowError("Allocation failed.");
        return (void *)0x0;
      }
      Range::Range((Range *)local_40,range.end,(void *)((long)range.end + (long)iVar1 + 4));
      Tree<NULLC::Range>::insert((Tree<NULLC::Range> *)bigBlocks,(Range *)local_40);
      *(int *)range.end = iVar1;
      puStack_20 = (ulong *)((long)range.end + 4);
      ptr._4_4_ = iVar1;
    }
    usedMemory = ptr._4_4_ + usedMemory;
    if (puStack_20 == (ulong *)0x0) {
      nullcThrowError("ERROR: allocation failed");
      _type_local = (ulong *)0x0;
    }
    else {
      local_44 = 0;
      if ((type != 0) &&
         (pEVar2 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                             ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),type),
         (pEVar2->typeFlags & 1) != 0)) {
        local_44 = (uint)OBJECT_FINALIZABLE;
      }
      memset(puStack_20,0,(long)iVar1);
      *puStack_20 = (ulong)(local_44 | type << 8);
      _type_local = puStack_20 + 1;
    }
  }
  return _type_local;
}

Assistant:

void* NULLC::AllocObject(int size, unsigned type)
{
	if(size < 0)
	{
		nullcThrowError("ERROR: requested memory size is less than zero");
		return NULL;
	}

	void *data = NULL;
	size += sizeof(markerType);

	if((unsigned int)(usedMemory + size) > globalMemoryLimit)
	{
		CollectMemory();

		if((unsigned int)(usedMemory + size) > globalMemoryLimit)
		{
			nullcThrowError("ERROR: reached global memory maximum");
			return NULL;
		}
	}
	else if((unsigned int)(usedMemory + size) > collectableMinimum)
	{
		CollectMemory();
	}

	unsigned int realSize = size;
	if(size <= 64)
	{
		if(size <= 16)
		{
			if(size <= 8)
			{
				data = pool8.Alloc();
				realSize = 8;
			}else{
				data = pool16.Alloc();
				realSize = 16;
			}
		}else{
			if(size <= 32)
			{
				data = pool32.Alloc();
				realSize = 32;
			}else{
				data = pool64.Alloc();
				realSize = 64;
			}
		}
	}else{
		if(size <= 256)
		{
			if(size <= 128)
			{
				data = pool128.Alloc();
				realSize = 128;
			}else{
				data = pool256.Alloc();
				realSize = 256;
			}
		}else{
			if(size <= 512)
			{
				data = pool512.Alloc();
				realSize = 512;
			}else{
				void *ptr = NULLC::alignedAlloc(size - sizeof(markerType), 4 + sizeof(markerType));
				if(ptr == NULL)
				{
					nullcThrowError("Allocation failed.");
					return NULL;
				}

				Range range(ptr, (char*)ptr + size + 4);
				bigBlocks.insert(range);

				realSize = *(int*)ptr = size;
				data = (char*)ptr + 4;
			}
		}
	}
	usedMemory += realSize;

	if(data == NULL)
	{
		nullcThrowError("ERROR: allocation failed");
		return NULL;
	}
	int finalize = 0;
	if(type && (linker->exTypes[type].typeFlags & ExternTypeInfo::TYPE_HAS_FINALIZER))
		finalize = (int)OBJECT_FINALIZABLE;

	memset(data, 0, size);
	*(markerType*)data = finalize | (type << 8);
	return (char*)data + sizeof(markerType);
}